

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeRestoreCursorPosition(BtCursor *pCur)

{
  uint local_20;
  int local_1c;
  int skipNext;
  int rc;
  BtCursor *pCur_local;
  
  if (pCur->eState == '\x04') {
    pCur_local._4_4_ = pCur->skipNext;
  }
  else {
    pCur->eState = '\0';
    _skipNext = pCur;
    local_1c = btreeMoveto(pCur,pCur->pKey,pCur->nKey,0,(int *)&local_20);
    if (local_1c == 0) {
      sqlite3_free(_skipNext->pKey);
      _skipNext->pKey = (void *)0x0;
      _skipNext->skipNext = local_20 | _skipNext->skipNext;
      if ((_skipNext->skipNext != 0) && (_skipNext->eState == '\x01')) {
        _skipNext->eState = '\x02';
      }
    }
    pCur_local._4_4_ = local_1c;
  }
  return pCur_local._4_4_;
}

Assistant:

static int btreeRestoreCursorPosition(BtCursor *pCur){
  int rc;
  int skipNext;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState>=CURSOR_REQUIRESEEK );
  if( pCur->eState==CURSOR_FAULT ){
    return pCur->skipNext;
  }
  pCur->eState = CURSOR_INVALID;
  rc = btreeMoveto(pCur, pCur->pKey, pCur->nKey, 0, &skipNext);
  if( rc==SQLITE_OK ){
    sqlite3_free(pCur->pKey);
    pCur->pKey = 0;
    assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_INVALID );
    pCur->skipNext |= skipNext;
    if( pCur->skipNext && pCur->eState==CURSOR_VALID ){
      pCur->eState = CURSOR_SKIPNEXT;
    }
  }
  return rc;
}